

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp_uint_t sexp_bignum_hi(sexp a)

{
  sexp_uint_t sVar1;
  bool bVar2;
  sexp_uint_t i;
  sexp a_local;
  
  i = (a->value).string.offset;
  do {
    sVar1 = i;
    i = sVar1 - 1;
    bVar2 = false;
    if (i != 0) {
      bVar2 = *(long *)((long)&a->value + sVar1 * 8 + 8) == 0;
    }
  } while (bVar2);
  return sVar1;
}

Assistant:

sexp_uint_t sexp_bignum_hi (sexp a) {
  sexp_uint_t i=sexp_bignum_length(a)-1;
  while ((i>0) && ! sexp_bignum_data(a)[i])
    i--;
  return i+1;
}